

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::texcoord3f> *value)

{
  bool bVar1;
  float3 v;
  array<float,_3UL> local_24;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    ParseBasicTypeTuple<float,3ul>(this,&local_24);
    *(undefined8 *)&value->contained = local_24._M_elems._0_8_;
    *(float *)((long)&value->contained + 8) = local_24._M_elems[2];
    bVar1 = true;
    if (value->has_value_ != false) {
      return true;
    }
  }
  value->has_value_ = bVar1;
  return true;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::texcoord3f> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::texcoord3f v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}